

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

size_t __thiscall wasm::anon_unknown_0::RecGroupHasher::hash(RecGroupHasher *this,Type type)

{
  uintptr_t *puVar1;
  Exactness EVar2;
  ulong uVar3;
  HeapType type_00;
  size_t sVar4;
  const_iterator __begin2;
  uintptr_t *puVar5;
  const_iterator __end2;
  Type local_40;
  Type type_local;
  
  type_local.id = (uintptr_t)(type.id < 7);
  if (type.id < 7) {
    uVar3 = type.id + 0x9e3779b97f4a8c15;
  }
  else {
    uVar3 = (ulong)((uint)type.id & 1);
    type_local.id = uVar3 + 0x9e3779b97f4a7c15 ^ type_local.id;
    local_40.id = type.id;
    if (uVar3 == 0) {
      uVar3 = ((ulong)((uint)type.id >> 1 & 1) | 0xa81af155173f23d6) + type_local.id * 0x1000 ^
              type_local.id;
      EVar2 = wasm::Type::getExactness(&local_40);
      uVar3 = uVar3 * 0x1000 + -0x61c8864680b583eb + (uVar3 >> 4) + (ulong)EVar2 ^ uVar3;
      type_00 = wasm::Type::getHeapType(&local_40);
      sVar4 = hash((RecGroupHasher *)(this->group).id,type_00);
      return (uVar3 >> 4) + uVar3 * 0x1000 + sVar4 + 0x9e3779b97f4a7c15 ^ uVar3;
    }
    puVar5 = *(uintptr_t **)(type.id & 0xfffffffffffffffe);
    puVar1 = (uintptr_t *)((long *)(type.id & 0xfffffffffffffffe))[1];
    uVar3 = (long)puVar1 - (long)puVar5 >> 3;
    for (; puVar1 != puVar5; puVar5 = puVar5 + 1) {
      sVar4 = hash(this,(Type)*puVar5);
      uVar3 = uVar3 ^ uVar3 * 0x1000 + -0x61c8864680b583eb + (uVar3 >> 4) + sVar4;
    }
    uVar3 = type_local.id * 0x1000 + -0x57e50eaae8c0dc2a + uVar3;
  }
  return uVar3 ^ type_local.id;
}

Assistant:

size_t RecGroupHasher::hash(Type type) const {
  size_t digest = wasm::hash(type.isBasic());
  if (type.isBasic()) {
    wasm::rehash(digest, type.getID());
    return digest;
  }
  wasm::rehash(digest, type.isTuple());
  if (type.isTuple()) {
    hash_combine(digest, hash(type.getTuple()));
    return digest;
  }
  assert(type.isRef());
  wasm::rehash(digest, type.getNullability());
  wasm::rehash(digest, type.getExactness());
  hash_combine(digest, hash(type.getHeapType()));
  return digest;
}